

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O3

void __thiscall luna::VM::CheckArithType(VM *this,Value *v1,Value *v2,char *op)

{
  RuntimeException *this_00;
  pair<const_char_*,_int> pVar1;
  
  if ((v1->type_ == ValueT_Number) && (v2->type_ == ValueT_Number)) {
    return;
  }
  pVar1 = GetCurrentInstructionPos(this);
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x20);
  RuntimeException::RuntimeException(this_00,pVar1.first,pVar1.second,v1,v2,op);
  __cxa_throw(this_00,&RuntimeException::typeinfo,Exception::~Exception);
}

Assistant:

void VM::CheckArithType(const Value *v1, const Value *v2, const char *op) const
    {
        if (v1->type_ != ValueT_Number || v2->type_ != ValueT_Number)
        {
            auto pos = GetCurrentInstructionPos();
            throw RuntimeException(pos.first, pos.second, v1, v2, op);
        }
    }